

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_fall_off_cliff(player *p)

{
  short sVar1;
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var2;
  wchar_t wVar3;
  feature *pfVar4;
  level_conflict *plVar5;
  level_conflict *plVar6;
  level *lev;
  wchar_t dam;
  wchar_t i;
  player *p_local;
  
  plVar5 = world->levels;
  sVar1 = p->place;
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  pfVar4 = square_feat((chunk *)cave,grid);
  msg(pfVar4->hurt_msg);
  p->last_place = p->place;
  if (plVar5[sVar1].locality == LOC_MOUNTAIN_TOP) {
    plVar5 = level_by_name(world,plVar5[sVar1].down);
    player_change_place(p,plVar5->index);
    _Var2 = player_of_has(p,L'\v');
    if (_Var2) {
      equip_learn_flag(p,L'\v');
      lev._0_4_ = damroll(2,8);
      wVar3 = damroll(2,8);
      player_inc_timed(p,L'\t',wVar3,true,true,true);
      wVar3 = damroll(2,8);
      player_inc_timed(p,L'\b',wVar3,true,true,true);
    }
    else {
      lev._0_4_ = damroll(4,8);
      wVar3 = damroll(4,8);
      player_inc_timed(p,L'\t',wVar3,true,true,true);
      wVar3 = damroll(4,8);
      player_inc_timed(p,L'\b',wVar3,true,true,true);
    }
    grid_00.x = (p->grid).x;
    grid_00.y = (p->grid).y;
    pfVar4 = square_feat((chunk *)cave,grid_00);
    take_hit(p,(wchar_t)lev,pfVar4->die_msg);
  }
  else if (plVar5[sVar1].locality == LOC_NAN_DUNGORTHEB) {
    lev._4_4_ = 0;
    while (((int)lev._4_4_ < 1 && (world->levels[p->place].south != (char *)0x0))) {
      plVar6 = level_by_name(world,plVar5[sVar1].south);
      player_change_place(p,plVar6->index);
      _Var2 = player_of_has(p,L'\v');
      if (_Var2) {
        equip_learn_flag(p,L'\v');
        lev._0_4_ = damroll(2,8);
        wVar3 = damroll(2,8);
        player_inc_timed(p,L'\t',wVar3,true,true,true);
        wVar3 = damroll(2,8);
        player_inc_timed(p,L'\b',wVar3,true,true,true);
      }
      else {
        lev._0_4_ = damroll(4,8);
        wVar3 = damroll(4,8);
        player_inc_timed(p,L'\t',wVar3,true,true,true);
        wVar3 = damroll(4,8);
        player_inc_timed(p,L'\b',wVar3,true,true,true);
      }
      grid_01.x = (p->grid).x;
      grid_01.y = (p->grid).y;
      pfVar4 = square_feat((chunk *)cave,grid_01);
      take_hit(p,(wchar_t)lev,pfVar4->die_msg);
      lev._4_4_ = Rand_div(3);
    }
  }
  return;
}

Assistant:

void player_fall_off_cliff(struct player *p)
{
	int i, dam;
	struct level *lev = &world->levels[p->place];

	msg(square_feat(cave, p->grid)->hurt_msg);

	/* Where we fell from */
	p->last_place = p->place;

	/* From the mountaintop, or down Nan Dungortheb */
	if (lev->locality == LOC_MOUNTAIN_TOP) {
		player_change_place(p, level_by_name(world, lev->down)->index);

		if (player_of_has(p, OF_FEATHER)) {
			equip_learn_flag(p, OF_FEATHER);
			dam = damroll(2, 8);
			(void) player_inc_timed(p, TMD_STUN, damroll(2, 8), true, true,
									true);
			(void) player_inc_timed(p, TMD_CUT, damroll(2, 8), true, true,
									true);
		} else {
			dam = damroll(4, 8);
			(void) player_inc_timed(p, TMD_STUN, damroll(4, 8), true, true,
									true);
			(void) player_inc_timed(p, TMD_CUT, damroll(4, 8), true, true,
									true);
		}
		take_hit(p, dam, square_feat(cave, p->grid)->die_msg);
	} else if (lev->locality == LOC_NAN_DUNGORTHEB) {
		/* Fall at least one level */
		for (i = 0; i < 1; i = randint0(3)) {
			/* Check we haven't come to the end */
			if (!world->levels[p->place].south) break;

			player_change_place(p, level_by_name(world, lev->south)->index);

			if (player_of_has(p, OF_FEATHER)) {
				equip_learn_flag(p, OF_FEATHER);
				dam = damroll(2, 8);
				(void) player_inc_timed(p, TMD_STUN, damroll(2, 8), true, true,
										true);
				(void) player_inc_timed(p, TMD_CUT, damroll(2, 8), true, true,
										true);
			} else {
				dam = damroll(4, 8);
				(void) player_inc_timed(p, TMD_STUN, damroll(4, 8), true, true,
										true);
				(void) player_inc_timed(p, TMD_CUT, damroll(4, 8), true, true,
										true);
			}
			take_hit(p, dam, square_feat(cave, p->grid)->die_msg);
		}
	}
}